

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O3

double __thiscall
Knn::computeDis(Knn *this,vector<double,_std::allocator<double>_> *v1,
               vector<double,_std::allocator<double>_> *v2)

{
  double dVar1;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> local_20;
  
  operator-<double,_double>(&local_20,v1,v2);
  dVar1 = operator*(&local_20,&local_20);
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar1;
}

Assistant:

double Knn::computeDis(const vector<double>& v1, const vector<double>& v2){
    auto v = v1 - v2;
    double di = v*v;
    return di;
}